

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

void __thiscall cmMakefile::AddDefineFlag(cmMakefile *this,char *flag,string *dflags)

{
  size_type sVar1;
  pointer pcVar2;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  allocator local_69;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  sVar1 = dflags->_M_string_length;
  std::__cxx11::string::string((string *)&local_48," ",&local_69);
  std::operator+(&local_68,&local_48,flag);
  std::__cxx11::string::append((string *)dflags);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  pcVar2 = (dflags->_M_dataplus)._M_p;
  __first._M_current = pcVar2 + sVar1 + 1;
  local_68._M_dataplus._M_p._0_1_ = 10;
  local_48._M_dataplus._M_p._0_1_ = 0x20;
  std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
            (__first,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )(pcVar2 + dflags->_M_string_length),(char *)&local_68,(char *)&local_48);
  local_68._M_dataplus._M_p._0_1_ = 0xd;
  local_48._M_dataplus._M_p._0_1_ = 0x20;
  std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
            (__first,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )((dflags->_M_dataplus)._M_p + dflags->_M_string_length),(char *)&local_68,
             (char *)&local_48);
  return;
}

Assistant:

void cmMakefile::AddDefineFlag(const char* flag, std::string& dflags)
{
  // remove any \n\r
  std::string::size_type initSize = dflags.size();
  dflags += std::string(" ") + flag;
  std::string::iterator flagStart = dflags.begin() + initSize + 1;
  std::replace(flagStart, dflags.end(), '\n', ' ');
  std::replace(flagStart, dflags.end(), '\r', ' ');
}